

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O1

int xmlStrVPrintf(xmlChar *buf,int len,char *msg,__va_list_tag *ap)

{
  int iVar1;
  
  if (msg == (char *)0x0 || buf == (xmlChar *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = vsnprintf((char *)buf,(long)len,msg,ap);
    buf[(long)len - 1] = '\0';
  }
  return iVar1;
}

Assistant:

int
xmlStrVPrintf(xmlChar *buf, int len, const char *msg, va_list ap) {
    int ret;

    if((buf == NULL) || (msg == NULL)) {
        return(-1);
    }

    ret = vsnprintf((char *) buf, len, (const char *) msg, ap);
    buf[len - 1] = 0; /* be safe ! */

    return(ret);
}